

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

QVariant * __thiscall QListWidgetItem::data(QListWidgetItem *this,int role)

{
  qsizetype qVar1;
  const_reference pQVar2;
  QList<QWidgetItemData> *this_00;
  int in_EDX;
  long in_RSI;
  QVariant *in_RDI;
  int i;
  qsizetype in_stack_ffffffffffffffb8;
  int local_34;
  int local_18;
  
  local_34 = in_EDX;
  if (in_EDX == 2) {
    local_34 = 0;
  }
  local_18 = 0;
  while( true ) {
    this_00 = (QList<QWidgetItemData> *)(long)local_18;
    qVar1 = QList<QWidgetItemData>::size((QList<QWidgetItemData> *)(*(long *)(in_RSI + 0x18) + 8));
    if (qVar1 <= (long)this_00) {
      ::QVariant::QVariant((QVariant *)0x89c3e2);
      return in_RDI;
    }
    pQVar2 = QList<QWidgetItemData>::at(this_00,in_stack_ffffffffffffffb8);
    if (pQVar2->role == local_34) break;
    local_18 = local_18 + 1;
  }
  pQVar2 = QList<QWidgetItemData>::at(this_00,in_stack_ffffffffffffffb8);
  ::QVariant::QVariant(in_RDI,(QVariant *)&pQVar2->value);
  return in_RDI;
}

Assistant:

QVariant QListWidgetItem::data(int role) const
{
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (int i = 0; i < d->values.size(); ++i)
        if (d->values.at(i).role == role)
            return d->values.at(i).value;
    return QVariant();
}